

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_test.cxx
# Opt level: O2

int main(int argc,char **argv)

{
  initializer_list<unsigned_long> __l;
  initializer_list<bool> __l_00;
  allocator_type local_152;
  allocator local_151;
  _Bvector_base<std::allocator<bool>_> local_150;
  string local_128;
  string local_108;
  unsigned_long local_e8 [3];
  TestRange<bool> local_d0;
  TestRange<unsigned_long> local_98;
  TestSuite ts;
  
  TestSuite::TestSuite(&ts,argc,argv);
  ts.options.printTestMessage = false;
  std::__cxx11::string::string((string *)&local_108,"buffer basic test",&local_151);
  local_e8[0] = 0x400;
  local_e8[1] = 0x8000;
  local_e8[2] = 0x10000;
  __l._M_len = 3;
  __l._M_array = local_e8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_150,__l,&local_152);
  TestRange<unsigned_long>::TestRange
            (&local_98,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_150);
  TestSuite::doTest<unsigned_long,int(*)(unsigned_long)>
            (&ts,&local_108,buffer_test::buffer_basic_test,&local_98);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_98.array.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_150);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::string((string *)&local_128,"buffer serializer test",&local_151);
  local_e8[0] = CONCAT62(local_e8[0]._2_6_,1);
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)local_e8;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_150,__l_00,(allocator_type *)&local_152);
  TestRange<bool>::TestRange(&local_d0,(vector<bool,_std::allocator<bool>_> *)&local_150);
  TestSuite::doTest<bool,int(*)(bool)>(&ts,&local_128,buffer_test::buffer_serializer_test,&local_d0)
  ;
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&local_d0.array.super__Bvector_base<std::allocator<bool>_>);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_150);
  std::__cxx11::string::~string((string *)&local_128);
  TestSuite::~TestSuite(&ts);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
    TestSuite ts(argc, argv);

    ts.options.printTestMessage = false;

    ts.doTest( "buffer basic test",
               buffer_basic_test,
               TestRange<size_t>( {1024, 0x8000, 0x10000} ) );

    ts.doTest( "buffer serializer test",
               buffer_serializer_test,
               TestRange<bool>( {true, false} ) );

    return 0;
}